

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# svector_test.cc
# Opt level: O0

void __thiscall
fizplex::SVectorTest_ChangeValsThroughIteratorSetsRightVal_Test::TestBody
          (SVectorTest_ChangeValsThroughIteratorSetsRightVal_Test *this)

{
  bool bVar1;
  iterator ind;
  reference pNVar2;
  char *message;
  AssertionResult gtest_ar;
  Nonzero *n;
  iterator __end1;
  iterator __begin1;
  SVector *__range1;
  SVector v;
  double in_stack_000002d0;
  double in_stack_000002d8;
  char *in_stack_000002e0;
  char *in_stack_000002e8;
  SVector *in_stack_ffffffffffffff08;
  undefined7 in_stack_ffffffffffffff10;
  undefined1 in_stack_ffffffffffffff17;
  SVector *this_00;
  AssertHelper local_c8;
  Message in_stack_ffffffffffffff40;
  initializer_list<fizplex::SVector::Nonzero> in_stack_ffffffffffffff48;
  __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
  local_88;
  SVector *local_80;
  undefined8 local_78;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 *local_30;
  undefined8 local_28;
  SVector local_20;
  
  local_48 = 7;
  uStack_40 = 0xc000e147ae147ae1;
  local_58 = 2;
  uStack_50 = 0x4022000000000000;
  local_68 = 1;
  uStack_60 = 0x4008000000000000;
  local_78 = 0;
  uStack_70 = 0xc000000000000000;
  local_30 = &local_78;
  local_28 = 4;
  this_00 = &local_20;
  SVector::SVector((SVector *)in_stack_ffffffffffffff40.ss_.ptr_,in_stack_ffffffffffffff48);
  local_80 = this_00;
  local_88._M_current = (Nonzero *)SVector::begin(in_stack_ffffffffffffff08);
  ind = SVector::end(in_stack_ffffffffffffff08);
  while (bVar1 = __gnu_cxx::operator!=
                           ((__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                             *)CONCAT17(in_stack_ffffffffffffff17,in_stack_ffffffffffffff10),
                            (__normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
                             *)in_stack_ffffffffffffff08), bVar1) {
    pNVar2 = __gnu_cxx::
             __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
             ::operator*(&local_88);
    pNVar2->value = pNVar2->value * 3.0;
    __gnu_cxx::
    __normal_iterator<fizplex::SVector::Nonzero_*,_std::vector<fizplex::SVector::Nonzero,_std::allocator<fizplex::SVector::Nonzero>_>_>
    ::operator++(&local_88);
  }
  SVector::get_value(this_00,(size_t)ind._M_current);
  testing::internal::CmpHelperFloatingPointEQ<double>
            (in_stack_000002e8,in_stack_000002e0,in_stack_000002d8,in_stack_000002d0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool
                    ((AssertionResult *)&stack0xffffffffffffff48);
  if (!bVar1) {
    testing::Message::Message((Message *)&stack0xffffffffffffff40);
    message = testing::AssertionResult::failure_message((AssertionResult *)0x1b1d6d);
    testing::internal::AssertHelper::AssertHelper
              (&local_c8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/LeFiz[P]Fizplex/src/svector_test.cc"
               ,0x2f,message);
    testing::internal::AssertHelper::operator=(&local_c8,(Message *)&stack0xffffffffffffff40);
    testing::internal::AssertHelper::~AssertHelper(&local_c8);
    testing::Message::~Message((Message *)0x1b1db9);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)0x1b1df9);
  SVector::~SVector((SVector *)0x1b1e06);
  return;
}

Assistant:

TEST(SVectorTest, ChangeValsThroughIteratorSetsRightVal) {
  SVector v = {{0, -2}, {1, 3}, {2, 9}, {7, -2.11}};
  for (auto &n : v)
    n.value *= 3;
  EXPECT_DOUBLE_EQ(27.0, v.get_value(2));
}